

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timeline.hpp
# Opt level: O2

bool ableton::link::operator==(Timeline *lhs,Timeline *rhs)

{
  bool bVar1;
  tuple<const_ableton::link::Tempo_&,_const_ableton::link::Beats_&,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&>
  local_30;
  tuple<const_ableton::link::Tempo_&,_const_ableton::link::Beats_&,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&>
  local_18;
  
  local_18.
  super__Tuple_impl<0UL,_const_ableton::link::Tempo_&,_const_ableton::link::Beats_&,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&>
  .
  super__Tuple_impl<1UL,_const_ableton::link::Beats_&,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&>
  .super__Head_base<1UL,_const_ableton::link::Beats_&,_false>._M_head_impl = &lhs->beatOrigin;
  local_18.
  super__Tuple_impl<0UL,_const_ableton::link::Tempo_&,_const_ableton::link::Beats_&,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&>
  .
  super__Tuple_impl<1UL,_const_ableton::link::Beats_&,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&>
  .super__Tuple_impl<2UL,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&>.
  super__Head_base<2UL,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&,_false>.
  _M_head_impl = (_Head_base<2UL,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&,_false>
                  )&lhs->timeOrigin;
  local_30.
  super__Tuple_impl<0UL,_const_ableton::link::Tempo_&,_const_ableton::link::Beats_&,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&>
  .
  super__Tuple_impl<1UL,_const_ableton::link::Beats_&,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&>
  .super__Head_base<1UL,_const_ableton::link::Beats_&,_false>._M_head_impl = &rhs->beatOrigin;
  local_30.
  super__Tuple_impl<0UL,_const_ableton::link::Tempo_&,_const_ableton::link::Beats_&,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&>
  .
  super__Tuple_impl<1UL,_const_ableton::link::Beats_&,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&>
  .super__Tuple_impl<2UL,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&>.
  super__Head_base<2UL,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&,_false>.
  _M_head_impl = (_Head_base<2UL,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&,_false>
                  )&rhs->timeOrigin;
  local_30.
  super__Tuple_impl<0UL,_const_ableton::link::Tempo_&,_const_ableton::link::Beats_&,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&>
  .super__Head_base<0UL,_const_ableton::link::Tempo_&,_false>._M_head_impl = &rhs->tempo;
  local_18.
  super__Tuple_impl<0UL,_const_ableton::link::Tempo_&,_const_ableton::link::Beats_&,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&>
  .super__Head_base<0UL,_const_ableton::link::Tempo_&,_false>._M_head_impl = &lhs->tempo;
  bVar1 = std::
          __tuple_compare<std::tuple<const_ableton::link::Tempo_&,_const_ableton::link::Beats_&,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&>,_std::tuple<const_ableton::link::Tempo_&,_const_ableton::link::Beats_&,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&>,_0UL,_3UL>
          ::__eq(&local_18,&local_30);
  return bVar1;
}

Assistant:

bool operator==(const Timeline& lhs, const Timeline& rhs)
  {
    return std::tie(lhs.tempo, lhs.beatOrigin, lhs.timeOrigin)
           == std::tie(rhs.tempo, rhs.beatOrigin, rhs.timeOrigin);
  }